

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O3

int16_t place_monster(chunk *c,loc_conflict grid,monster *mon,uint8_t origin)

{
  bitflag *flags;
  undefined2 uVar1;
  undefined2 uVar2;
  monster_drop *pmVar3;
  _Bool _Var4;
  _Bool _Var5;
  _Bool _Var6;
  _Bool _Var7;
  _Bool _Var8;
  uint8_t uVar9;
  short sVar10;
  wchar_t wVar11;
  uint32_t uVar12;
  monster *pmVar13;
  monster_conflict *mon_00;
  monster_conflict *pmVar14;
  monster_race *pmVar15;
  monster_lore *pmVar16;
  object_kind *k;
  object *poVar17;
  wchar_t wVar18;
  long lVar19;
  artifact *paVar20;
  wchar_t idx;
  ulong uVar21;
  wchar_t wVar22;
  _Bool local_6d;
  
  wVar11 = mon->midx;
  _Var4 = square_in_bounds((chunk_conflict *)c,(loc)grid);
  if (!_Var4) {
    __assert_fail("square_in_bounds(c, grid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-make.c"
                  ,0x3ef,
                  "int16_t place_monster(struct chunk *, struct loc, struct monster *, uint8_t)");
  }
  pmVar13 = square_monster((chunk_conflict *)c,(loc)grid);
  if (pmVar13 != (monster *)0x0) {
    __assert_fail("!square_monster(c, grid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-make.c"
                  ,0x3f0,
                  "int16_t place_monster(struct chunk *, struct loc, struct monster *, uint8_t)");
  }
  if (wVar11 < L'\x01') {
    sVar10 = mon_pop(c);
    if (sVar10 == 0) {
      return 0;
    }
  }
  else {
    sVar10 = (short)mon->midx;
    uVar1 = c->mon_max;
    uVar2 = c->mon_cnt;
    c->mon_max = uVar1 + 1;
    c->mon_cnt = uVar2 + 1;
  }
  idx = (wchar_t)sVar10;
  mon_00 = (monster_conflict *)cave_monster((chunk_conflict *)c,idx);
  memcpy(mon_00,mon,0x1a0);
  mon_00->midx = idx;
  square_set_mon((chunk_conflict *)c,(loc)grid,idx);
  (mon_00->grid).x = grid.x;
  (mon_00->grid).y = grid.y;
  pmVar14 = (monster_conflict *)square_monster((chunk_conflict *)c,(loc)grid);
  if (pmVar14 != mon_00) {
    __assert_fail("square_monster(c, grid) == new_mon",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-make.c"
                  ,0x406,
                  "int16_t place_monster(struct chunk *, struct loc, struct monster *, uint8_t)");
  }
  monster_group_assign((chunk_conflict *)c,(monster *)mon_00,mon->group_info,L'\0' < wVar11);
  update_mon(mon_00,c,true);
  _Var4 = flag_has_dbg(mon_00->race->flags,0xb,0x11,"new_mon->race->flags","RF_MULTIPLY");
  if (_Var4) {
    c->num_repro = c->num_repro + L'\x01';
  }
  pmVar15 = mon_00->original_race;
  if (pmVar15 == (monster_race *)0x0) {
    pmVar15 = mon_00->race;
  }
  pmVar15->cur_num = pmVar15->cur_num + L'\x01';
  if (origin != '\0') {
    pmVar16 = get_lore(mon_00->race);
    pmVar15 = mon_00->original_race;
    if (pmVar15 == (monster_race *)0x0) {
      pmVar15 = mon_00->race;
    }
    flags = pmVar15->flags;
    _Var4 = flag_has_dbg(flags,0xb,0x26,"effective_race->flags","RF_DROP_GREAT");
    local_6d = true;
    if (!_Var4) {
      local_6d = flag_has_dbg(flags,0xb,0x25,"effective_race->flags","RF_DROP_GOOD");
    }
    _Var5 = flag_has_dbg(flags,0xb,0x1e,"effective_race->flags","RF_ONLY_ITEM");
    _Var6 = flag_has_dbg(flags,0xb,0x1d,"effective_race->flags","RF_ONLY_GOLD");
    wVar11 = mon_create_drop_count(pmVar15,false,false,(int *)0x0);
    _Var7 = monster_is_unique((monster *)mon_00);
    if ((_Var7) && (wVar22 = wVar11 - (uint)pmVar16->thefts, wVar11 = L'\0', L'\0' < wVar22)) {
      wVar11 = wVar22;
    }
    wVar22 = pmVar15->level;
    _Var7 = monster_is_unique((monster *)mon_00);
    wVar18 = wVar22;
    if (_Var7) {
      wVar18 = wVar22 * 2;
      if (wVar22 + L'\x0f' < wVar22 * 2) {
        wVar18 = wVar22 + L'\x0f';
      }
    }
    wVar22 = (c->depth + wVar18) / 2;
    if (wVar22 <= wVar18) {
      wVar22 = wVar18;
    }
    wVar18 = L'd';
    if (wVar22 < L'd') {
      wVar18 = wVar22;
    }
    _Var8 = flag_has_dbg(flags,0xb,2,"effective_race->flags","RF_QUESTOR");
    if (((_Var8) && (pmVar15->level == L'd')) && (1 < z_info->a_max)) {
      uVar21 = 1;
      lVar19 = 0x140;
      do {
        paVar20 = a_info;
        k = lookup_kind(*(wchar_t *)(a_info->flags + lVar19 + -0x28),
                        *(wchar_t *)(a_info->flags + lVar19 + -0x24));
        _Var8 = flag_has_dbg(k->kind_flags,2,5,"kind->kind_flags","KF_QUEST_ART");
        if (_Var8) {
          paVar20 = (artifact *)(paVar20->flags + lVar19 + -0x48);
          poVar17 = (object *)mem_zalloc(0x138);
          object_prep(poVar17,k,L'd',RANDOMISE);
          poVar17->artifact = paVar20;
          copy_artifact_data(poVar17,paVar20);
          mark_artifact_created(paVar20,true);
          poVar17->origin = origin;
          uVar9 = convert_depth_to_origin(c->depth);
          poVar17->origin_depth = uVar9;
          poVar17->origin_race = mon_00->race;
          poVar17->number = '\x01';
          _Var8 = monster_carry(c,mon_00,poVar17);
          if (!_Var8) {
            mark_artifact_created(poVar17->artifact,false);
            object_wipe(poVar17);
            mem_free(poVar17);
          }
        }
        uVar21 = uVar21 + 1;
        lVar19 = lVar19 + 0x140;
      } while (uVar21 < z_info->a_max);
    }
    for (pmVar3 = pmVar15->drops; pmVar3 != (monster_drop *)0x0; pmVar3 = pmVar3->next) {
      uVar12 = Rand_div(100);
      if (uVar12 < pmVar3->percent_chance) {
        if (pmVar3->kind == (object_kind *)0x0) {
          if (pmVar3->tval == L'\0') {
            __assert_fail("drop->tval",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-make.c"
                          ,0x34a,"_Bool mon_create_drop(struct chunk *, struct monster *, uint8_t)")
            ;
          }
          poVar17 = make_object(c,wVar18,local_6d,_Var4,_Var7,(int32_t *)0x0,pmVar3->tval);
        }
        else {
          poVar17 = (object *)mem_zalloc(0x138);
          object_prep(poVar17,pmVar3->kind,wVar18,RANDOMISE);
          apply_magic(poVar17,wVar18,true,local_6d,_Var4,_Var7);
        }
        if (poVar17 != (object *)0x0) {
          poVar17->origin = origin;
          uVar9 = convert_depth_to_origin(c->depth);
          poVar17->origin_depth = uVar9;
          poVar17->origin_race = pmVar15;
          uVar9 = '\x01';
          if (poVar17->artifact == (artifact *)0x0) {
            uVar12 = Rand_div(pmVar3->max - pmVar3->min);
            uVar9 = (char)uVar12 + (char)pmVar3->min;
          }
          poVar17->number = uVar9;
          _Var8 = monster_carry(c,mon_00,poVar17);
          if (!_Var8) {
            object_wipe(poVar17);
            mem_free(poVar17);
          }
        }
      }
    }
    if (L'\0' < wVar11) {
      do {
        if ((_Var5) || ((!_Var6 && (uVar12 = Rand_div(100), 0x31 < (int)uVar12)))) {
          poVar17 = make_object(c,wVar18,local_6d,_Var4,_Var7,(int32_t *)0x0,L'\0');
          if (poVar17 != (object *)0x0) goto LAB_00171cd1;
        }
        else {
          poVar17 = make_gold(wVar18,"any");
LAB_00171cd1:
          poVar17->origin = origin;
          uVar9 = convert_depth_to_origin(c->depth);
          poVar17->origin_depth = uVar9;
          poVar17->origin_race = pmVar15;
          _Var8 = monster_carry(c,mon_00,poVar17);
          if (!_Var8) {
            if (poVar17->artifact != (artifact *)0x0) {
              mark_artifact_created(poVar17->artifact,false);
            }
            object_wipe(poVar17);
            mem_free(poVar17);
          }
        }
        wVar11 = wVar11 + L'\xffffffff';
      } while (wVar11 != L'\0');
    }
    if (mon_00->race->mimic_kinds != (monster_mimic *)0x0) {
      mon_create_mimicked_object(c,(monster *)mon_00,idx);
    }
  }
  return sVar10;
}

Assistant:

int16_t place_monster(struct chunk *c, struct loc grid, struct monster *mon,
		uint8_t origin)
{
	int16_t m_idx;
	struct monster *new_mon;
	struct monster_group_info *info = mon->group_info;
	bool loading = mon->midx > 0;

	assert(square_in_bounds(c, grid));
	assert(!square_monster(c, grid));

	/* Get a new record, or recycle the old one */
	if (loading) {
		m_idx = mon->midx;
		c->mon_max++;
		c->mon_cnt++;
	} else {
		m_idx = mon_pop(c);
		if (!m_idx) return 0;
	}

	/* Copy the monster */
	new_mon = cave_monster(c, m_idx);
	memcpy(new_mon, mon, sizeof(struct monster));

	/* Set the ID */
	new_mon->midx = m_idx;

	/* Set the location */
	square_set_mon(c, grid, new_mon->midx);
	new_mon->grid = grid;
	assert(square_monster(c, grid) == new_mon);

	/* Assign monster to its monster group */
	monster_group_assign(c, new_mon, info, loading);

	update_mon(new_mon, c, true);

	/* Count the number of "reproducers" */
	if (rf_has(new_mon->race->flags, RF_MULTIPLY)) c->num_repro++;

	/* Count racial occurrences */
	if (new_mon->original_race) new_mon->original_race->cur_num++;
	else new_mon->race->cur_num++;

	/* Create the monster's drop, if any */
	if (origin)
		(void)mon_create_drop(c, new_mon, origin);

	/* Make mimics start mimicking */
	if (origin && new_mon->race->mimic_kinds) {
		mon_create_mimicked_object(c, new_mon, m_idx);
	}

	/* Result */
	return m_idx;
}